

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O1

int envy_bios_parse_xpiodir(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  envy_bios_xpio *peVar6;
  uint uVar7;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  char *__format;
  ulong uVar11;
  int iVar12;
  
  uVar3 = (bios->gpio).xpiodir.offset;
  iVar5 = 0;
  if (uVar3 != 0) {
    if ((uint)uVar3 < bios->length) {
      (bios->gpio).xpiodir.version = bios->data[(uint)uVar3];
      iVar5 = 0;
    }
    else {
      (bios->gpio).xpiodir.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar5 = -0xe;
    }
    lVar9 = (ulong)(bios->gpio).xpiodir.offset + 1;
    if ((uint)lVar9 < bios->length) {
      (bios->gpio).xpiodir.hlen = bios->data[lVar9];
      iVar10 = 0;
    }
    else {
      (bios->gpio).xpiodir.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar10 = -0xe;
    }
    lVar9 = (ulong)(bios->gpio).xpiodir.offset + 2;
    if ((uint)lVar9 < bios->length) {
      (bios->gpio).xpiodir.entriesnum = bios->data[lVar9];
      iVar4 = 0;
    }
    else {
      (bios->gpio).xpiodir.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    lVar9 = (ulong)(bios->gpio).xpiodir.offset + 3;
    if ((uint)lVar9 < bios->length) {
      (bios->gpio).xpiodir.rlen = bios->data[lVar9];
      iVar12 = 0;
    }
    else {
      (bios->gpio).xpiodir.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar12 = -0xe;
    }
    envy_bios_block(bios,(uint)(bios->gpio).xpiodir.offset,
                    (uint)(bios->gpio).xpiodir.entriesnum * (uint)(bios->gpio).xpiodir.rlen +
                    (uint)(bios->gpio).xpiodir.hlen,"XPIODIR",-1);
    if (((iVar10 == 0 && iVar5 == 0) && iVar4 == 0) && iVar12 == 0) {
      if ((bios->gpio).xpiodir.version != ((bios->gpio).version & 0xf0)) {
        envy_bios_parse_xpiodir_cold_1();
      }
      uVar1 = (bios->gpio).xpiodir.version;
      if ((uVar1 == '@') || (uVar1 == '0')) {
        bVar2 = (bios->gpio).xpiodir.hlen;
        uVar11 = (ulong)bVar2;
        if (bVar2 < 4) {
          __format = "XPIODIR table header too short [%d < %d]\n";
          uVar8 = 4;
        }
        else {
          uVar7 = (uint)(bios->gpio).xpiodir.rlen;
          if (1 < uVar7) {
            if (bVar2 != 4) {
              fprintf(_stderr,"XPIODIR table header longer than expected [%d > %d]\n",uVar11,4);
            }
            bVar2 = (bios->gpio).xpiodir.rlen;
            if (2 < bVar2) {
              fprintf(_stderr,"XPIODIR table record longer than expected [%d > %d]\n",(ulong)bVar2,2
                     );
            }
            peVar6 = (envy_bios_xpio *)calloc((ulong)(bios->gpio).xpiodir.entriesnum,0x18);
            (bios->gpio).xpiodir.entries = peVar6;
            if (peVar6 == (envy_bios_xpio *)0x0) {
              return -0xc;
            }
            if ((bios->gpio).xpiodir.entriesnum != '\0') {
              lVar9 = 0;
              uVar11 = 0;
              do {
                uVar7 = (uint)(bios->gpio).xpiodir.rlen * (int)uVar11 +
                        (uint)(bios->gpio).xpiodir.hlen + *(int *)&(bios->gpio).xpiodir;
                peVar6 = (envy_bios_xpio *)((long)&((bios->gpio).xpiodir.entries)->offset + lVar9);
                if ((uVar7 & 0xffff) + 1 < bios->length) {
                  peVar6->offset = *(uint16_t *)(bios->data + (ushort)uVar7);
                  iVar5 = 0;
                }
                else {
                  peVar6->offset = 0;
                  fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
                  iVar5 = -0xe;
                }
                if (iVar5 != 0) goto LAB_00259072;
                iVar5 = envy_bios_parse_xpio(bios,peVar6,(int)uVar11);
                if (iVar5 != 0) {
                  envy_bios_parse_xpiodir_cold_2();
                }
                uVar11 = uVar11 + 1;
                lVar9 = lVar9 + 0x18;
              } while (uVar11 < (bios->gpio).xpiodir.entriesnum);
            }
            (bios->gpio).xpiodir.valid = '\x01';
            return 0;
          }
          __format = "XPIODIR table record too short [%d < %d]\n";
          uVar11 = (ulong)uVar7;
          uVar8 = 2;
        }
        fprintf(_stderr,__format,uVar11,uVar8);
      }
      else {
        envy_bios_parse_xpiodir_cold_3();
      }
      iVar5 = -0x16;
    }
    else {
LAB_00259072:
      iVar5 = -0xe;
    }
  }
  return iVar5;
}

Assistant:

int envy_bios_parse_xpiodir (struct envy_bios *bios) {
	struct envy_bios_xpiodir *xpiodir = &bios->gpio.xpiodir;
	int err = 0;
	if (!xpiodir->offset)
		return 0;
	err |= bios_u8(bios, xpiodir->offset, &xpiodir->version);
	err |= bios_u8(bios, xpiodir->offset+1, &xpiodir->hlen);
	err |= bios_u8(bios, xpiodir->offset+2, &xpiodir->entriesnum);
	err |= bios_u8(bios, xpiodir->offset+3, &xpiodir->rlen);
	envy_bios_block(bios, xpiodir->offset, xpiodir->hlen + xpiodir->rlen * xpiodir->entriesnum, "XPIODIR", -1);
	if (err)
		return -EFAULT;
	int wanthlen = 0;
	int wantrlen = 0;
	if (xpiodir->version != (bios->gpio.version & 0xf0))
		ENVY_BIOS_WARN("XPIODIR version mismatch with GPIO\n");
	switch (xpiodir->version) {
		case 0x30:
		case 0x40:
			wanthlen = 4;
			wantrlen = 2;
			break;
		default:
			ENVY_BIOS_ERR("Unknown XPIODIR table version %d.%d\n", xpiodir->version >> 4, xpiodir->version & 0xf);
			return -EINVAL;
	}
	if (xpiodir->hlen < wanthlen) {
		ENVY_BIOS_ERR("XPIODIR table header too short [%d < %d]\n", xpiodir->hlen, wanthlen);
		return -EINVAL;
	}
	if (xpiodir->rlen < wantrlen) {
		ENVY_BIOS_ERR("XPIODIR table record too short [%d < %d]\n", xpiodir->rlen, wantrlen);
		return -EINVAL;
	}
	if (xpiodir->hlen > wanthlen) {
		ENVY_BIOS_WARN("XPIODIR table header longer than expected [%d > %d]\n", xpiodir->hlen, wanthlen);
	}
	if (xpiodir->rlen > wantrlen) {
		ENVY_BIOS_WARN("XPIODIR table record longer than expected [%d > %d]\n", xpiodir->rlen, wantrlen);
	}
	xpiodir->entries = calloc(xpiodir->entriesnum, sizeof *xpiodir->entries);
	if (!xpiodir->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < xpiodir->entriesnum; i++) {
		uint16_t eoff = xpiodir->offset + xpiodir->hlen + xpiodir->rlen * i;
		struct envy_bios_xpio *xpio = &xpiodir->entries[i];
		err |= bios_u16(bios, eoff, &xpio->offset);
		if (err)
			return -EFAULT;
		if (envy_bios_parse_xpio(bios, xpio, i))
			ENVY_BIOS_ERR("Failed to parse XPIO table at 0x%04x version %d.%d\n", xpio->offset, xpio->version >> 4, xpio->version & 0xf);
	}
	xpiodir->valid = 1;
	return 0;
}